

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O3

grp_stack_data pop_grp_stack(grp_stack *mystack)

{
  grp_stack_item *__ptr;
  grp_stack_item_struct *pgVar1;
  grp_stack_item_struct *pgVar2;
  grp_stack_data in_RAX;
  grp_stack_data extraout_RAX;
  
  if ((mystack != (grp_stack *)0x0) && (__ptr = mystack->top, __ptr != (grp_stack_item *)0x0)) {
    pgVar1 = __ptr->next;
    pgVar2 = __ptr->prev;
    pgVar2->next = pgVar1;
    pgVar1->prev = pgVar2;
    free(__ptr);
    mystack->top = pgVar2;
    mystack->stack_size = mystack->stack_size - 1;
    in_RAX = extraout_RAX;
    if (mystack->stack_size == 0) {
      mystack->top = (grp_stack_item *)0x0;
    }
  }
  return in_RAX;
}

Assistant:

static grp_stack_data pop_grp_stack(grp_stack* mystack) {
  grp_stack_data retval = grp_stack_default;
  if(mystack && mystack->top) {
    grp_stack_item* newtop = mystack->top->prev;
    retval = grp_stack_remove(mystack->top);
    mystack->top = newtop;
    if(0 == --mystack->stack_size) mystack->top = NULL;
  }
  return retval;
}